

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_173::FieldInfoScanner::create(FieldInfoScanner *this)

{
  FunctionStructValuesMap<wasm::LUBFinder> *functionNewInfos;
  FunctionStructValuesMap<wasm::LUBFinder> *functionSetGetInfos;
  FieldInfoScanner *this_00;
  long in_RSI;
  
  functionNewInfos = *(FunctionStructValuesMap<wasm::LUBFinder> **)(in_RSI + 0x130);
  functionSetGetInfos = *(FunctionStructValuesMap<wasm::LUBFinder> **)(in_RSI + 0x138);
  this_00 = (FieldInfoScanner *)operator_new(0x140);
  FieldInfoScanner(this_00,functionNewInfos,functionSetGetInfos);
  *(FieldInfoScanner **)this = this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FieldInfoScanner>(functionNewInfos,
                                              functionSetGetInfos);
  }